

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

void check_FX(FX *fx68k)

{
  DLword *SAddr;
  ushort uVar1;
  DLword DVar2;
  LispPTR LVar3;
  uint uVar4;
  LispPTR *pLVar5;
  
  if ((*(ushort *)&fx68k->field_0x2 & 0xe000) != 0xc000) {
    error("CheckFX:NOT FX");
  }
  uVar1 = fx68k->nextblock;
  DVar2 = StackOffsetFromNative(fx68k);
  if (uVar1 < DVar2) {
    error("FX\'s nextblock field < the FFX.");
  }
  SAddr = &fx68k[-1].clink;
  DVar2 = StackOffsetFromNative(SAddr);
  if ((fx68k->alink & 1) == 0) {
    LVar3 = LAddrFromNative(SAddr);
    uVar4 = LVar3 & 0xffff;
  }
  else {
    uVar4 = (uint)fx68k->blink;
  }
  if (uVar4 != DVar2) {
    if ((fx68k->alink & 1) == 0) {
      LVar3 = LAddrFromNative(SAddr);
      DVar2 = (DLword)LVar3;
    }
    else {
      DVar2 = fx68k->blink;
    }
    pLVar5 = NativeAligned4FromStackOffset(DVar2);
    if (((fx68k[-1].blink & 0x200) == 0) || (*SAddr != (DLword)*pLVar5)) {
      error("CheckFX:bad residual case");
      return;
    }
  }
  return;
}

Assistant:

void check_FX(FX *fx68k) {
  Bframe *dummybf, *mtmp;
  int mblink;

  /* The FX better really be an FX */

  if (((FX *)(fx68k))->flags != STK_FX) error("CheckFX:NOT FX");

  /* Make sure the NEXTBLOCK field of the FX */
  /* Points BEYOND the start of the FX; some */
  /* stack blocks have been corrupted this   */
  /* way.  --JDS 2/3/98                      */

  if (fx68k->nextblock < StackOffsetFromNative(fx68k) /*+FRAMESIZE*/) {
    error("FX's nextblock field < the FFX.");
  }

  /* Now make sure the FX is connected to */
  /* a Basic Frame.                       */

  dummybf = (Bframe *)DUMMYBF(fx68k);

  /* Check for connection via BLINK field: */
  if (StackOffsetFromNative(dummybf) == GETBLINK(fx68k)) return;

  mblink = GETBLINK(fx68k);
  mtmp = (Bframe *)NativeAligned4FromStackOffset(mblink);
  if ((dummybf->residual != NIL) && (dummybf->ivar == mtmp->ivar))
    return;
  else
    error("CheckFX:bad residual case");

}